

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

Pda * namingConventions::makeNamePda(string *name)

{
  Node *pNVar1;
  Node *pNVar2;
  char cVar3;
  char cVar4;
  Pda *this;
  long *plVar5;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar6;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar7;
  uint uVar8;
  long *plVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  string alphabeth;
  string nodename;
  string __str;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  uint local_148;
  long local_140 [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Pda *)operator_new(0x90);
  Pda::Pda(this);
  local_190 = &local_180;
  local_188 = 0;
  local_180 = 0;
  if (name->_M_string_length != 0xffffffffffffffff) {
    uVar14 = 0;
    do {
      cVar4 = '\x01';
      uVar11 = (uint)uVar14;
      if (9 < uVar11) {
        uVar10 = uVar14;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          uVar8 = (uint)uVar10;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_00131296;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_00131296;
          }
          if (uVar8 < 10000) goto LAB_00131296;
          uVar10 = uVar10 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (99999 < uVar8);
        cVar4 = cVar4 + '\x01';
      }
LAB_00131296:
      local_150 = local_140;
      std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150,local_148,uVar11);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x1500e7);
      local_170 = &local_160;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_160 = *plVar9;
        lStack_158 = plVar5[3];
      }
      else {
        local_160 = *plVar9;
        local_170 = (long *)*plVar5;
      }
      local_168 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_150 != local_140) {
        operator_delete(local_150,local_140[0] + 1);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_170,local_168 + (long)local_170);
      Pda::addNode(this,&local_110,uVar11 == 0,name->_M_string_length == uVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_188 == 0) {
LAB_001313e4:
        std::__cxx11::string::push_back((char)&local_190);
      }
      else {
        lVar12 = 0;
        bVar13 = false;
        do {
          if (local_190[lVar12] == (name->_M_dataplus)._M_p[uVar14]) {
            bVar13 = true;
          }
          lVar12 = lVar12 + 1;
        } while (local_188 != lVar12);
        if (!bVar13) goto LAB_001313e4;
      }
      if (local_170 != &local_160) {
        operator_delete(local_170,local_160 + 1);
      }
      uVar14 = (ulong)(uVar11 + 1);
    } while (uVar14 < name->_M_string_length + 1);
  }
  uVar11 = 1;
  while( true ) {
    pvVar6 = Pda::getAllNodes(this);
    uVar14 = (ulong)(uVar11 - 1);
    if (((long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U <= uVar14) break;
    pvVar6 = Pda::getAllNodes(this);
    pNVar1 = (pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar14];
    pvVar6 = Pda::getAllNodes(this);
    pNVar2 = (pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," ","");
    Pda::addFunct(this,pNVar1,pNVar2,' ',&local_130,(name->_M_dataplus)._M_p[uVar14]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar11 = uVar11 + 1;
  }
  pvVar6 = Pda::getAllNodes(this);
  pNVar1 = *(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar6 = Pda::getAllNodes(this);
  pNVar2 = *(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_50,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_70,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_90,'(');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar6 = Pda::getAllNodes(this);
  pvVar7 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar7->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar6->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar7->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_b0,')');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_190,local_190 + local_188);
  Pda::setAlphabet(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_190,local_190 + local_188);
  Pda::setStackAlphabet(this,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  return this;
}

Assistant:

Pda *namingConventions::makeNamePda(std::string &name) {
    Pda *p = new Pda();
    std::string alphabeth;
    for (unsigned int c = 0; c < name.size() + 1; ++c) {
        std::string nodename = "q" + std::to_string(c);
        p->addNode(nodename, c == 0, c == name.size());
        bool present = false;
        for (char &ch: alphabeth) {
            if (ch == name[c]) {
                present = true;
            }
        }
        if (!present) {
            alphabeth += name[c];
        }
    }
    for (unsigned int i = 0; i < p->getAllNodes().size() - 1; ++i) {
        p->addFunct(p->getAllNodes()[i], p->getAllNodes()[i + 1], ' ', " ", name[i]);
    }
    p->addFunct(p->getAllNodes()[0], p->getAllNodes()[0], ' ', " ", ' ');
    p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
                " ", ' ');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", '(');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", ')');


    p->setAlphabet(alphabeth);
    p->setStackAlphabet(alphabeth);
    return p;
}